

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialAnalyzerSettings.cpp
# Opt level: O0

void __thiscall SerialAnalyzerSettings::SerialAnalyzerSettings(SerialAnalyzerSettings *this)

{
  AnalyzerSettingInterfaceChannel *this_00;
  pointer pAVar1;
  AnalyzerSettingInterfaceInteger *this_01;
  pointer pAVar2;
  AnalyzerSettingInterfaceBool *this_02;
  pointer pAVar3;
  AnalyzerSettingInterfaceNumberList *pAVar4;
  pointer pAVar5;
  ostream *poVar6;
  ulong uVar7;
  Channel *pCVar8;
  char *pcVar9;
  uint uVar10;
  string local_1c8 [32];
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  uint local_20;
  U32 i;
  SerialAnalyzerSettings *local_10;
  SerialAnalyzerSettings *this_local;
  
  local_10 = this;
  AnalyzerSettings::AnalyzerSettings(&this->super_AnalyzerSettings);
  *(undefined ***)this = &PTR__SerialAnalyzerSettings_00119d68;
  uVar7 = 0xffffffffffffffff;
  Channel::Channel(&this->mInputChannel,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  this->mBitRate = 0x2580;
  this->mBitsPerTransfer = 8;
  this->mShiftOrder = LsbFirst;
  this->mStopBits = 1.0;
  this->mParity = None;
  this->mInverted = false;
  this->mUseAutobaud = false;
  this->mSerialMode = Normal;
  std::
  unique_ptr<AnalyzerSettingInterfaceChannel,std::default_delete<AnalyzerSettingInterfaceChannel>>::
  unique_ptr<std::default_delete<AnalyzerSettingInterfaceChannel>,void>
            ((unique_ptr<AnalyzerSettingInterfaceChannel,std::default_delete<AnalyzerSettingInterfaceChannel>>
              *)&this->mInputChannelInterface);
  std::
  unique_ptr<AnalyzerSettingInterfaceInteger,std::default_delete<AnalyzerSettingInterfaceInteger>>::
  unique_ptr<std::default_delete<AnalyzerSettingInterfaceInteger>,void>
            ((unique_ptr<AnalyzerSettingInterfaceInteger,std::default_delete<AnalyzerSettingInterfaceInteger>>
              *)&this->mBitRateInterface);
  std::
  unique_ptr<AnalyzerSettingInterfaceNumberList,std::default_delete<AnalyzerSettingInterfaceNumberList>>
  ::unique_ptr<std::default_delete<AnalyzerSettingInterfaceNumberList>,void>
            ((unique_ptr<AnalyzerSettingInterfaceNumberList,std::default_delete<AnalyzerSettingInterfaceNumberList>>
              *)&this->mBitsPerTransferInterface);
  std::
  unique_ptr<AnalyzerSettingInterfaceNumberList,std::default_delete<AnalyzerSettingInterfaceNumberList>>
  ::unique_ptr<std::default_delete<AnalyzerSettingInterfaceNumberList>,void>
            ((unique_ptr<AnalyzerSettingInterfaceNumberList,std::default_delete<AnalyzerSettingInterfaceNumberList>>
              *)&this->mShiftOrderInterface);
  std::
  unique_ptr<AnalyzerSettingInterfaceNumberList,std::default_delete<AnalyzerSettingInterfaceNumberList>>
  ::unique_ptr<std::default_delete<AnalyzerSettingInterfaceNumberList>,void>
            ((unique_ptr<AnalyzerSettingInterfaceNumberList,std::default_delete<AnalyzerSettingInterfaceNumberList>>
              *)&this->mStopBitsInterface);
  std::
  unique_ptr<AnalyzerSettingInterfaceNumberList,std::default_delete<AnalyzerSettingInterfaceNumberList>>
  ::unique_ptr<std::default_delete<AnalyzerSettingInterfaceNumberList>,void>
            ((unique_ptr<AnalyzerSettingInterfaceNumberList,std::default_delete<AnalyzerSettingInterfaceNumberList>>
              *)&this->mParityInterface);
  std::
  unique_ptr<AnalyzerSettingInterfaceNumberList,std::default_delete<AnalyzerSettingInterfaceNumberList>>
  ::unique_ptr<std::default_delete<AnalyzerSettingInterfaceNumberList>,void>
            ((unique_ptr<AnalyzerSettingInterfaceNumberList,std::default_delete<AnalyzerSettingInterfaceNumberList>>
              *)&this->mInvertedInterface);
  std::unique_ptr<AnalyzerSettingInterfaceBool,std::default_delete<AnalyzerSettingInterfaceBool>>::
  unique_ptr<std::default_delete<AnalyzerSettingInterfaceBool>,void>
            ((unique_ptr<AnalyzerSettingInterfaceBool,std::default_delete<AnalyzerSettingInterfaceBool>>
              *)&this->mUseAutobaudInterface);
  std::
  unique_ptr<AnalyzerSettingInterfaceNumberList,std::default_delete<AnalyzerSettingInterfaceNumberList>>
  ::unique_ptr<std::default_delete<AnalyzerSettingInterfaceNumberList>,void>
            ((unique_ptr<AnalyzerSettingInterfaceNumberList,std::default_delete<AnalyzerSettingInterfaceNumberList>>
              *)&this->mSerialModeInterface);
  this_00 = (AnalyzerSettingInterfaceChannel *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar7);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(this_00);
  std::
  unique_ptr<AnalyzerSettingInterfaceChannel,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
  ::reset(&this->mInputChannelInterface,this_00);
  pAVar1 = std::
           unique_ptr<AnalyzerSettingInterfaceChannel,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
           ::operator->(&this->mInputChannelInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)pAVar1,"Input Channel");
  pAVar1 = std::
           unique_ptr<AnalyzerSettingInterfaceChannel,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
           ::operator->(&this->mInputChannelInterface);
  pCVar8 = &this->mInputChannel;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)pAVar1);
  this_01 = (AnalyzerSettingInterfaceInteger *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pCVar8);
  AnalyzerSettingInterfaceInteger::AnalyzerSettingInterfaceInteger(this_01);
  std::
  unique_ptr<AnalyzerSettingInterfaceInteger,_std::default_delete<AnalyzerSettingInterfaceInteger>_>
  ::reset(&this->mBitRateInterface,this_01);
  pAVar2 = std::
           unique_ptr<AnalyzerSettingInterfaceInteger,_std::default_delete<AnalyzerSettingInterfaceInteger>_>
           ::operator->(&this->mBitRateInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)pAVar2,"Bit Rate (Bits/s)");
  pAVar2 = std::
           unique_ptr<AnalyzerSettingInterfaceInteger,_std::default_delete<AnalyzerSettingInterfaceInteger>_>
           ::operator->(&this->mBitRateInterface);
  AnalyzerSettingInterfaceInteger::SetMax((int)pAVar2);
  pAVar2 = std::
           unique_ptr<AnalyzerSettingInterfaceInteger,_std::default_delete<AnalyzerSettingInterfaceInteger>_>
           ::operator->(&this->mBitRateInterface);
  AnalyzerSettingInterfaceInteger::SetMin((int)pAVar2);
  pAVar2 = std::
           unique_ptr<AnalyzerSettingInterfaceInteger,_std::default_delete<AnalyzerSettingInterfaceInteger>_>
           ::operator->(&this->mBitRateInterface);
  uVar7 = (ulong)this->mBitRate;
  AnalyzerSettingInterfaceInteger::SetInteger((int)pAVar2);
  this_02 = (AnalyzerSettingInterfaceBool *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar7);
  AnalyzerSettingInterfaceBool::AnalyzerSettingInterfaceBool(this_02);
  std::unique_ptr<AnalyzerSettingInterfaceBool,_std::default_delete<AnalyzerSettingInterfaceBool>_>
  ::reset(&this->mUseAutobaudInterface,this_02);
  pAVar3 = std::
           unique_ptr<AnalyzerSettingInterfaceBool,_std::default_delete<AnalyzerSettingInterfaceBool>_>
           ::operator->(&this->mUseAutobaudInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)pAVar3,"");
  pAVar3 = std::
           unique_ptr<AnalyzerSettingInterfaceBool,_std::default_delete<AnalyzerSettingInterfaceBool>_>
           ::operator->(&this->mUseAutobaudInterface);
  AnalyzerSettingInterfaceBool::SetCheckBoxText((char *)pAVar3);
  pAVar3 = std::
           unique_ptr<AnalyzerSettingInterfaceBool,_std::default_delete<AnalyzerSettingInterfaceBool>_>
           ::operator->(&this->mUseAutobaudInterface);
  uVar7 = (ulong)(this->mUseAutobaud & 1);
  AnalyzerSettingInterfaceBool::SetValue(SUB81(pAVar3,0));
  pAVar4 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar7);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar4);
  std::
  unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ::reset(&this->mBitsPerTransferInterface,pAVar4);
  pAVar5 = std::
           unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
           ::operator->(&this->mBitsPerTransferInterface);
  pcVar9 = "Bits per Frame";
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)pAVar5,"Bits per Frame");
  for (local_20 = 1; local_20 < 0x41; local_20 = local_20 + 1) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    if (local_20 == 1) {
      std::operator<<(local_198,"1 Bit per Transfer");
    }
    else if (local_20 == 8) {
      std::operator<<(local_198,"8 Bits per Transfer (Standard)");
    }
    else {
      poVar6 = (ostream *)std::ostream::operator<<(local_198,local_20);
      std::operator<<(poVar6," Bits per Transfer");
    }
    pAVar5 = std::
             unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
             ::operator->(&this->mBitsPerTransferInterface);
    uVar7 = (ulong)local_20;
    std::__cxx11::stringstream::str();
    pcVar9 = (char *)std::__cxx11::string::c_str();
    AnalyzerSettingInterfaceNumberList::AddNumber((double)uVar7,(char *)pAVar5,pcVar9);
    std::__cxx11::string::~string(local_1c8);
    std::__cxx11::stringstream::~stringstream(local_1a8);
  }
  std::
  unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ::operator->(&this->mBitsPerTransferInterface);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mBitsPerTransfer);
  pAVar4 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar9);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar4);
  std::
  unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ::reset(&this->mStopBitsInterface,pAVar4);
  pAVar5 = std::
           unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
           ::operator->(&this->mStopBitsInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)pAVar5,"Stop Bits");
  pAVar5 = std::
           unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
           ::operator->(&this->mStopBitsInterface);
  AnalyzerSettingInterfaceNumberList::AddNumber(1.0,(char *)pAVar5,"1 Stop Bit (Standard)");
  pAVar5 = std::
           unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
           ::operator->(&this->mStopBitsInterface);
  AnalyzerSettingInterfaceNumberList::AddNumber(1.5,(char *)pAVar5,"1.5 Stop Bits");
  pAVar5 = std::
           unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
           ::operator->(&this->mStopBitsInterface);
  pcVar9 = "2 Stop Bits";
  AnalyzerSettingInterfaceNumberList::AddNumber(2.0,(char *)pAVar5,"2 Stop Bits");
  std::
  unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ::operator->(&this->mStopBitsInterface);
  AnalyzerSettingInterfaceNumberList::SetNumber(this->mStopBits);
  pAVar4 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar9);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar4);
  std::
  unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ::reset(&this->mParityInterface,pAVar4);
  pAVar5 = std::
           unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
           ::operator->(&this->mParityInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)pAVar5,"Parity Bit");
  pAVar5 = std::
           unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
           ::operator->(&this->mParityInterface);
  AnalyzerSettingInterfaceNumberList::AddNumber(0.0,(char *)pAVar5,"No Parity Bit (Standard)");
  pAVar5 = std::
           unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
           ::operator->(&this->mParityInterface);
  AnalyzerSettingInterfaceNumberList::AddNumber(1.0,(char *)pAVar5,"Even Parity Bit");
  pAVar5 = std::
           unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
           ::operator->(&this->mParityInterface);
  pcVar9 = "Odd Parity Bit";
  AnalyzerSettingInterfaceNumberList::AddNumber(2.0,(char *)pAVar5,"Odd Parity Bit");
  std::
  unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ::operator->(&this->mParityInterface);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mParity);
  pAVar4 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar9);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar4);
  std::
  unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ::reset(&this->mShiftOrderInterface,pAVar4);
  pAVar5 = std::
           unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
           ::operator->(&this->mShiftOrderInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)pAVar5,"Significant Bit");
  pAVar5 = std::
           unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
           ::operator->(&this->mShiftOrderInterface);
  AnalyzerSettingInterfaceNumberList::AddNumber
            (1.0,(char *)pAVar5,"Least Significant Bit Sent First (Standard)");
  pAVar5 = std::
           unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
           ::operator->(&this->mShiftOrderInterface);
  pcVar9 = "Most Significant Bit Sent First";
  AnalyzerSettingInterfaceNumberList::AddNumber
            (0.0,(char *)pAVar5,"Most Significant Bit Sent First");
  std::
  unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ::operator->(&this->mShiftOrderInterface);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mShiftOrder);
  pAVar4 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar9);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar4);
  std::
  unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ::reset(&this->mInvertedInterface,pAVar4);
  pAVar5 = std::
           unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
           ::operator->(&this->mInvertedInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)pAVar5,"Signal inversion");
  pAVar5 = std::
           unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
           ::operator->(&this->mInvertedInterface);
  AnalyzerSettingInterfaceNumberList::AddNumber(0.0,(char *)pAVar5,"Non Inverted (Standard)");
  pAVar5 = std::
           unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
           ::operator->(&this->mInvertedInterface);
  pcVar9 = "Inverted";
  AnalyzerSettingInterfaceNumberList::AddNumber(1.0,(char *)pAVar5,"Inverted");
  std::
  unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ::operator->(&this->mInvertedInterface);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)(this->mInverted & 1));
  pAVar4 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar9);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar4);
  std::
  unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ::reset(&this->mSerialModeInterface,pAVar4);
  pAVar5 = std::
           unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
           ::operator->(&this->mSerialModeInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)pAVar5,"Mode");
  pAVar5 = std::
           unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
           ::operator->(&this->mSerialModeInterface);
  AnalyzerSettingInterfaceNumberList::AddNumber(0.0,(char *)pAVar5,"Normal");
  pAVar5 = std::
           unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
           ::operator->(&this->mSerialModeInterface);
  AnalyzerSettingInterfaceNumberList::AddNumber
            (1.0,(char *)pAVar5,"MP - Address indicated by MSB=0");
  pAVar5 = std::
           unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
           ::operator->(&this->mSerialModeInterface);
  AnalyzerSettingInterfaceNumberList::AddNumber
            (2.0,(char *)pAVar5,"MDB - Address indicated by MSB=1 (TX only)");
  std::
  unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ::operator->(&this->mSerialModeInterface);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mSerialMode);
  std::
  unique_ptr<AnalyzerSettingInterfaceChannel,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
  ::get(&this->mInputChannelInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  std::
  unique_ptr<AnalyzerSettingInterfaceInteger,_std::default_delete<AnalyzerSettingInterfaceInteger>_>
  ::get(&this->mBitRateInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  std::
  unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ::get(&this->mBitsPerTransferInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  std::
  unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ::get(&this->mStopBitsInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  std::
  unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ::get(&this->mParityInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  std::
  unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ::get(&this->mShiftOrderInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  std::
  unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ::get(&this->mInvertedInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  std::
  unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ::get(&this->mSerialModeInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  uVar10 = (uint)this;
  AnalyzerSettings::AddExportOption(uVar10,(char *)0x0);
  AnalyzerSettings::AddExportExtension(uVar10,(char *)0x0,"text");
  AnalyzerSettings::AddExportExtension(uVar10,(char *)0x0,"csv");
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mInputChannel,true);
  return;
}

Assistant:

SerialAnalyzerSettings::SerialAnalyzerSettings()
    : mInputChannel( UNDEFINED_CHANNEL ),
      mBitRate( 9600 ),
      mBitsPerTransfer( 8 ),
      mStopBits( 1.0 ),
      mParity( AnalyzerEnums::None ),
      mShiftOrder( AnalyzerEnums::LsbFirst ),
      mInverted( false ),
      mUseAutobaud( false ),
      mSerialMode( SerialAnalyzerEnums::Normal )
{
    mInputChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
    mInputChannelInterface->SetTitleAndTooltip( "Input Channel", "Standard Async Serial" );
    mInputChannelInterface->SetChannel( mInputChannel );

    mBitRateInterface.reset( new AnalyzerSettingInterfaceInteger() );
    mBitRateInterface->SetTitleAndTooltip( "Bit Rate (Bits/s)", "Specify the bit rate in bits per second." );
    mBitRateInterface->SetMax( 100000000 );
    mBitRateInterface->SetMin( 1 );
    mBitRateInterface->SetInteger( static_cast<int>( mBitRate ) );

    mUseAutobaudInterface.reset( new AnalyzerSettingInterfaceBool() );
    mUseAutobaudInterface->SetTitleAndTooltip(
        "", "With Autobaud turned on, the analyzer will run as usual, with the current bit rate.  At the same time, it will also keep "
            "track of the shortest pulse it detects. \nAfter analyzing all the data, if the bit rate implied by this shortest pulse is "
            "different by more than 10% from the specified bit rate, the bit rate will be changed and the analysis run again." );
    mUseAutobaudInterface->SetCheckBoxText( "Use Autobaud" );
    mUseAutobaudInterface->SetValue( mUseAutobaud );

    mBitsPerTransferInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mBitsPerTransferInterface->SetTitleAndTooltip( "Bits per Frame", "Select the number of bits per frame" );
    for( U32 i = 1; i <= 64; i++ )
    {
        std::stringstream ss;

        if( i == 1 )
            ss << "1 Bit per Transfer";
        else if( i == 8 )
            ss << "8 Bits per Transfer (Standard)";
        else
            ss << i << " Bits per Transfer";

        mBitsPerTransferInterface->AddNumber( i, ss.str().c_str(), "" );
    }
    mBitsPerTransferInterface->SetNumber( mBitsPerTransfer );


    mStopBitsInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mStopBitsInterface->SetTitleAndTooltip( "Stop Bits", "Specify the number of stop bits." );
    mStopBitsInterface->AddNumber( 1.0, "1 Stop Bit (Standard)", "" );
    mStopBitsInterface->AddNumber( 1.5, "1.5 Stop Bits", "" );
    mStopBitsInterface->AddNumber( 2.0, "2 Stop Bits", "" );
    mStopBitsInterface->SetNumber( mStopBits );


    mParityInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mParityInterface->SetTitleAndTooltip( "Parity Bit", "Specify None, Even, or Odd Parity." );
    mParityInterface->AddNumber( AnalyzerEnums::None, "No Parity Bit (Standard)", "" );
    mParityInterface->AddNumber( AnalyzerEnums::Even, "Even Parity Bit", "" );
    mParityInterface->AddNumber( AnalyzerEnums::Odd, "Odd Parity Bit", "" );
    mParityInterface->SetNumber( mParity );


    mShiftOrderInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mShiftOrderInterface->SetTitleAndTooltip( "Significant Bit",
                                              "Select if the most significant bit or least significant bit is transmitted first" );
    mShiftOrderInterface->AddNumber( AnalyzerEnums::LsbFirst, "Least Significant Bit Sent First (Standard)", "" );
    mShiftOrderInterface->AddNumber( AnalyzerEnums::MsbFirst, "Most Significant Bit Sent First", "" );
    mShiftOrderInterface->SetNumber( mShiftOrder );


    mInvertedInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mInvertedInterface->SetTitleAndTooltip( "Signal inversion", "Specify if the serial signal is inverted" );
    mInvertedInterface->AddNumber( false, "Non Inverted (Standard)", "" );
    mInvertedInterface->AddNumber( true, "Inverted", "" );

    mInvertedInterface->SetNumber( mInverted );
    enum Mode
    {
        Normal,
        MpModeRightZeroMeansAddress,
        MpModeRightOneMeansAddress,
        MpModeLeftZeroMeansAddress,
        MpModeLeftOneMeansAddress
    };

    mSerialModeInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mSerialModeInterface->SetTitleAndTooltip( "Mode", "" );
    mSerialModeInterface->AddNumber( SerialAnalyzerEnums::Normal, "Normal", "" );
    mSerialModeInterface->AddNumber( SerialAnalyzerEnums::MpModeMsbZeroMeansAddress, "MP - Address indicated by MSB=0",
                                     "Multi-processor, 9-bit serial" );
    mSerialModeInterface->AddNumber( SerialAnalyzerEnums::MpModeMsbOneMeansAddress, "MDB - Address indicated by MSB=1 (TX only)",
                                     "Multi-drop, 9-bit serial" );
    mSerialModeInterface->SetNumber( mSerialMode );

    AddInterface( mInputChannelInterface.get() );
    AddInterface( mBitRateInterface.get() );
    AddInterface( mBitsPerTransferInterface.get() );
    AddInterface( mStopBitsInterface.get() );
    AddInterface( mParityInterface.get() );
    AddInterface( mShiftOrderInterface.get() );
    AddInterface( mInvertedInterface.get() );
    AddInterface( mSerialModeInterface.get() );

    // AddExportOption( 0, "Export as text/csv file", "text (*.txt);;csv (*.csv)" );
    AddExportOption( 0, "Export as text/csv file" );
    AddExportExtension( 0, "text", "txt" );
    AddExportExtension( 0, "csv", "csv" );

    ClearChannels();
    AddChannel( mInputChannel, "Serial", false );
}